

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

ssize_t zip_entries_delete_mark(zip_t *zip,zip_entry_mark_t *entry_mark,int entry_num)

{
  int *piVar1;
  zip_modify_t zVar2;
  uint uVar3;
  mz_zip_internal_state *pmVar4;
  mz_zip_internal_state *pmVar5;
  FILE *__stream;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  void *__ptr;
  long lVar11;
  void *pvVar12;
  size_t sVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  zip_modify_t *pzVar18;
  ulong __off;
  int iVar19;
  ulong __off_00;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  size_t sVar27;
  ulong local_70;
  
  __ptr = calloc((long)entry_num,4);
  if (__ptr == (void *)0x0) {
    return -0x15;
  }
  pmVar4 = (zip->archive).m_pState;
  (zip->archive).m_zip_mode = MZ_ZIP_MODE_WRITING;
  if ((FILE *)pmVar4->m_pFile != (FILE *)0x0) {
    iVar8 = fseeko((FILE *)pmVar4->m_pFile,0,0);
    uVar25 = 0xfffffffffffffffd;
    if (iVar8 != 0) goto LAB_001109da;
  }
  uVar24 = (ulong)(uint)entry_num;
  if (entry_num < 1) {
    lVar26 = 0;
    local_70 = 0;
  }
  else {
    uVar22 = 0;
    uVar23 = 0;
    local_70 = 0;
    iVar8 = 0;
    uVar20 = 0;
    lVar26 = 0;
    do {
      lVar11 = (long)iVar8;
      iVar9 = iVar8 + 1;
      if (iVar8 + 1 < entry_num) {
        iVar9 = entry_num;
      }
      if (entry_mark[lVar11].type == MZ_KEEP) {
        pzVar18 = &entry_mark[lVar11 + 1].type;
        iVar19 = iVar8;
        do {
          lVar11 = lVar11 + 1;
          uVar22 = uVar22 + *(long *)(pzVar18 + -4);
          uVar23 = uVar22;
          iVar8 = iVar9;
          if ((long)uVar24 <= lVar11) break;
          iVar8 = iVar19 + 1;
          zVar2 = *pzVar18;
          pzVar18 = pzVar18 + 8;
          iVar19 = iVar8;
        } while (zVar2 == MZ_KEEP);
      }
      if (iVar8 < entry_num) {
        lVar15 = (long)iVar8 << 2;
        lVar11 = 0;
        do {
          if ((&entry_mark->type)[lVar15 * 2] != MZ_DELETE) {
            iVar8 = iVar8 - (int)lVar11;
            local_70 = local_70 - lVar11;
            goto LAB_001104ac;
          }
          *(undefined4 *)((long)__ptr + lVar15) = 1;
          uVar23 = uVar23 + (&entry_mark->lf_length)[lVar15];
          lVar26 = lVar26 + (&entry_mark->lf_length)[lVar15];
          lVar11 = lVar11 + -1;
          lVar15 = lVar15 + 4;
        } while ((long)iVar8 - uVar24 != lVar11);
        local_70 = local_70 - lVar11;
        iVar8 = entry_num;
      }
LAB_001104ac:
      while ((iVar8 < entry_num && (lVar11 = (long)iVar8, entry_mark[lVar11].type == MZ_MOVE))) {
        uVar20 = uVar20 + entry_mark[lVar11].lf_length;
        pvVar12 = (pmVar4->m_central_dir).m_p;
        if (pvVar12 == (void *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          __ptr = (void *)0x0;
        }
        else {
          piVar1 = (int *)((long)pvVar12 +
                          (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + lVar11 * 4) +
                          0x2a);
          *piVar1 = *piVar1 - (int)lVar26;
          iVar8 = iVar8 + 1;
        }
        if (pvVar12 == (void *)0x0) {
          return -3;
        }
      }
      pmVar5 = (zip->archive).m_pState;
      pvVar12 = calloc(1,0x1000);
      if (pvVar12 == (void *)0x0) {
        uVar25 = 0xffffffffffffffeb;
      }
      else {
        if ((long)uVar20 < 1) {
          uVar25 = 0;
        }
        else {
          uVar21 = 0;
          uVar16 = uVar20;
          __off = uVar22;
          __off_00 = uVar23;
          do {
            sVar27 = 0x1000;
            if (uVar16 < 0x1000) {
              sVar27 = uVar16;
            }
            __stream = (FILE *)pmVar5->m_pFile;
            if (__stream == (FILE *)0x0) {
              pvVar6 = pmVar5->m_pMem;
              if (pvVar6 == (void *)0x0) {
                uVar25 = 0xffffffffffffffed;
                goto LAB_00110769;
              }
              uVar25 = pmVar5->m_mem_size;
              uVar17 = 0xfffffffffffffff6;
              if ((__off <= uVar25) && (__off_00 <= uVar25)) {
                if (((long)((long)pvVar6 + __off) + sVar27 <= uVar25 + (long)pvVar6) &&
                   ((long)((long)pvVar6 + __off_00) + sVar27 <= uVar25 + (long)pvVar6)) {
                  memmove((void *)((long)pvVar6 + __off),(void *)((long)pvVar6 + __off_00),sVar27);
                  uVar17 = sVar27;
                }
              }
            }
            else {
              iVar9 = fseeko(__stream,__off_00,0);
              uVar17 = 0xffffffffffffffe5;
              if (iVar9 == 0) {
                sVar13 = fread(pvVar12,1,sVar27,__stream);
                uVar17 = 0xffffffffffffffe4;
                if (sVar13 == sVar27) {
                  iVar9 = fseeko(__stream,__off,0);
                  uVar17 = 0xffffffffffffffe5;
                  if ((iVar9 == 0) &&
                     (sVar13 = fwrite(pvVar12,1,sVar27,__stream), uVar17 = sVar27, sVar13 != sVar27)
                     ) {
                    uVar17 = 0xffffffffffffffe3;
                  }
                }
              }
            }
            uVar25 = uVar17;
            if (((long)uVar17 < 0) || (uVar25 = uVar21, uVar17 != sVar27)) break;
            __off = __off + sVar27;
            __off_00 = __off_00 + sVar27;
            uVar21 = uVar21 + sVar27;
            uVar17 = uVar16 - sVar27;
            bVar7 = (long)sVar27 <= (long)uVar16;
            uVar16 = uVar17;
            uVar25 = uVar21;
          } while (uVar17 != 0 && bVar7);
        }
        free(pvVar12);
      }
LAB_00110769:
      if (uVar25 != uVar20) goto joined_r0x001109fd;
      uVar22 = uVar22 + uVar20;
      uVar23 = uVar23 + uVar20;
    } while (iVar8 < entry_num);
  }
  (zip->archive).m_archive_size = (zip->archive).m_archive_size - lVar26;
  (zip->archive).m_total_files = entry_num - (int)local_70;
  iVar8 = 0;
  if (0 < entry_num) {
    uVar25 = 0;
    do {
      lVar26 = (long)(int)uVar25;
      uVar10 = (int)uVar25 + 1;
      if ((int)uVar10 < entry_num) {
        uVar10 = entry_num;
      }
      do {
        if (*(int *)((long)__ptr + lVar26 * 4) != 0) {
          uVar10 = (uint)lVar26;
          break;
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < (long)uVar24);
      uVar23 = (ulong)(int)uVar10;
      bVar7 = (int)uVar10 < entry_num;
      uVar25 = (ulong)uVar10;
      if ((int)uVar10 < entry_num) {
        uVar22 = uVar23;
        if (*(int *)((long)__ptr + uVar23 * 4) == 0) {
          bVar7 = true;
          uVar25 = (ulong)uVar10;
        }
        else {
          do {
            if (uVar24 - 1 == uVar22) {
              bVar7 = false;
              uVar25 = uVar24;
              goto LAB_00110844;
            }
            uVar25 = uVar22 + 1;
            lVar26 = uVar22 * 4;
            uVar22 = uVar25;
          } while (*(int *)((long)__ptr + lVar26 + 4) != 0);
          bVar7 = (long)uVar25 < (long)uVar24;
        }
      }
LAB_00110844:
      iVar8 = (int)uVar25;
      if (uVar10 != entry_num) {
        pvVar6 = (pmVar4->m_central_dir).m_p;
        pvVar14 = (pmVar4->m_central_dir_offsets).m_p;
        uVar10 = *(uint *)((long)pvVar14 + uVar23 * 4);
        uVar23 = (ulong)uVar10;
        sVar27 = 0;
        iVar9 = 0;
        pvVar12 = (void *)0x0;
        if (iVar8 != entry_num) {
          uVar3 = *(uint *)((long)pvVar14 + (long)iVar8 * 4);
          pvVar12 = (void *)((long)pvVar6 + (ulong)uVar3);
          sVar27 = (pmVar4->m_central_dir).m_size - (ulong)uVar3;
          iVar9 = uVar3 - uVar10;
        }
        if ((pvVar12 != (void *)0x0) && (uVar10 == 0)) {
          memmove(pvVar6,pvVar12,sVar27);
          pvVar14 = realloc((pmVar4->m_central_dir).m_p,sVar27);
          (pmVar4->m_central_dir).m_p = pvVar14;
          if (bVar7) {
            pvVar14 = (pmVar4->m_central_dir_offsets).m_p;
            uVar22 = (ulong)iVar8;
            do {
              piVar1 = (int *)((long)pvVar14 + uVar22 * 4);
              *piVar1 = *piVar1 - iVar9;
              uVar22 = uVar22 + 1;
            } while (uVar24 != uVar22);
          }
        }
        if (((pvVar12 != (void *)0x0) && (sVar27 * uVar23 != 0)) &&
           (memmove((void *)((long)pvVar6 + uVar23),pvVar12,sVar27), bVar7)) {
          pvVar12 = (pmVar4->m_central_dir_offsets).m_p;
          uVar22 = (ulong)iVar8;
          do {
            piVar1 = (int *)((long)pvVar12 + uVar22 * 4);
            *piVar1 = *piVar1 - iVar9;
            uVar22 = uVar22 + 1;
          } while (uVar24 != uVar22);
        }
        (pmVar4->m_central_dir).m_size = sVar27 + uVar23;
      }
    } while (iVar8 < entry_num);
    iVar8 = 0;
    if (0 < entry_num) {
      uVar25 = 0;
      iVar8 = 0;
      do {
        lVar26 = (long)(int)uVar25;
        uVar10 = (int)uVar25 + 1;
        if ((int)uVar10 < entry_num) {
          uVar10 = entry_num;
        }
        do {
          if (*(int *)((long)__ptr + lVar26 * 4) != 0) {
            uVar10 = (uint)lVar26;
            break;
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 < (long)uVar24);
        if (uVar10 == entry_num) break;
        uVar25 = (ulong)uVar10;
        uVar23 = (long)(int)uVar10;
        if ((int)uVar10 < entry_num) {
          do {
            uVar25 = uVar23;
            if (*(int *)((long)__ptr + uVar23 * 4) == 0) break;
            uVar23 = uVar23 + 1;
            uVar25 = uVar24;
          } while (uVar24 != uVar23);
        }
        iVar9 = (int)uVar25;
        if (entry_num - iVar9 != 0 && iVar9 <= entry_num) {
          pvVar12 = (pmVar4->m_central_dir_offsets).m_p;
          uVar23 = 0;
          do {
            *(undefined4 *)((long)pvVar12 + uVar23 * 4 + (long)(int)uVar10 * 4) =
                 *(undefined4 *)((long)pvVar12 + uVar23 * 4 + (long)iVar9 * 4);
            uVar23 = uVar23 + 1;
          } while ((uint)(entry_num - iVar9) != uVar23);
        }
        iVar8 = (iVar8 - uVar10) + iVar9;
      } while (iVar9 < entry_num);
    }
  }
  (pmVar4->m_central_dir_offsets).m_size = (long)(entry_num - iVar8) << 2;
  uVar25 = local_70;
joined_r0x001109fd:
  if (__ptr == (void *)0x0) {
    return uVar25;
  }
LAB_001109da:
  free(__ptr);
  return uVar25;
}

Assistant:

static ssize_t zip_entries_delete_mark(struct zip_t *zip,
                                       struct zip_entry_mark_t *entry_mark,
                                       int entry_num) {
  mz_uint64 writen_num = 0;
  mz_uint64 read_num = 0;
  size_t deleted_length = 0;
  size_t move_length = 0;
  int i = 0;
  size_t deleted_entry_num = 0;
  ssize_t n = 0;

  mz_bool *deleted_entry_flag_array =
      (mz_bool *)calloc(entry_num, sizeof(mz_bool));
  if (deleted_entry_flag_array == NULL) {
    return ZIP_EOOMEM;
  }

  mz_zip_internal_state *pState = zip->archive.m_pState;
  zip->archive.m_zip_mode = MZ_ZIP_MODE_WRITING;

  if (pState->m_pFile) {
    if (MZ_FSEEK64(pState->m_pFile, 0, SEEK_SET)) {
      CLEANUP(deleted_entry_flag_array);
      return ZIP_ENOENT;
    }
  }

  while (i < entry_num) {
    while ((i < entry_num) && (entry_mark[i].type == MZ_KEEP)) {
      writen_num += entry_mark[i].lf_length;
      read_num = writen_num;
      i++;
    }

    while ((i < entry_num) && (entry_mark[i].type == MZ_DELETE)) {
      deleted_entry_flag_array[i] = MZ_TRUE;
      read_num += entry_mark[i].lf_length;
      deleted_length += entry_mark[i].lf_length;
      i++;
      deleted_entry_num++;
    }

    while ((i < entry_num) && (entry_mark[i].type == MZ_MOVE)) {
      move_length += entry_mark[i].lf_length;
      mz_uint8 *p = &MZ_ZIP_ARRAY_ELEMENT(
          &pState->m_central_dir, mz_uint8,
          MZ_ZIP_ARRAY_ELEMENT(&pState->m_central_dir_offsets, mz_uint32, i));
      if (!p) {
        CLEANUP(deleted_entry_flag_array);
        return ZIP_ENOENT;
      }
      mz_uint32 offset = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
      offset -= (mz_uint32)deleted_length;
      MZ_WRITE_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS, offset);
      i++;
    }

    n = zip_files_move(zip, writen_num, read_num, move_length);
    if (n != (ssize_t)move_length) {
      CLEANUP(deleted_entry_flag_array);
      return n;
    }
    writen_num += move_length;
    read_num += move_length;
  }

  zip->archive.m_archive_size -= (mz_uint64)deleted_length;
  zip->archive.m_total_files =
      (mz_uint32)entry_num - (mz_uint32)deleted_entry_num;

  zip_central_dir_delete(pState, deleted_entry_flag_array, entry_num);
  CLEANUP(deleted_entry_flag_array);

  return (ssize_t)deleted_entry_num;
}